

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimRelAssignInputs
               (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsIn,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  int v;
  int iVar3;
  bool bVar4;
  
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x2ed,
                  "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  iVar2 = p->vCis->nSize;
  if (vSimsIn->nSize == iVar2 * nWordsIn) {
    v = 0;
    iVar1 = nWords / nWordsIn;
    if (nWords / nWordsIn < 1) {
      iVar1 = v;
    }
    while( true ) {
      if (iVar2 <= v) {
        return;
      }
      pObj = Gia_ManCi(p,v);
      iVar2 = Gia_ObjId(p,pObj);
      if (iVar2 == 0) break;
      iVar2 = iVar2 * nWords;
      iVar3 = iVar1;
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        __dest = Vec_WrdEntryP(vSims,iVar2);
        __src = Vec_WrdEntryP(vSimsIn,v * nWordsIn);
        memcpy(__dest,__src,(long)nWordsIn << 3);
        iVar2 = iVar2 + nWordsIn;
      }
      v = v + 1;
      iVar2 = p->vCis->nSize;
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x2ee,
                "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimRelAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsIn, Vec_Wrd_t * vSimsIn )
{
    int i, m, Id, nMints = nWords / nWordsIn;
    assert( Vec_WrdSize(vSims)   == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        for ( m = 0; m < nMints; m++ )
            memcpy( Vec_WrdEntryP(vSims, Id * nWords + nWordsIn * m), 
                    Vec_WrdEntryP(vSimsIn, i * nWordsIn), sizeof(word) * nWordsIn );
}